

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-split.cpp
# Opt level: O2

void anon_unknown.dwarf_3ea68::checkExists(string *path)

{
  char cVar1;
  undefined1 local_3a0 [8];
  ifstream infile;
  undefined1 local_198 [392];
  
  std::ifstream::ifstream(local_3a0,(string *)path,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::ifstream::~ifstream(local_3a0);
    return;
  }
  wasm::Fatal::Fatal((Fatal *)local_198);
  std::operator<<((ostream *)(local_198 + 0x10),"File not found: ");
  wasm::Fatal::operator<<((Fatal *)local_198,path);
  wasm::Fatal::~Fatal((Fatal *)local_198);
}

Assistant:

void checkExists(const std::string& path) {
  std::ifstream infile(path);
  if (!infile.is_open()) {
    Fatal() << "File not found: " << path;
  }
}